

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qduplicatetracker_p.h
# Opt level: O3

void __thiscall
QDuplicateTracker<QString,_32UL>::QDuplicateTracker(QDuplicateTracker<QString,_32UL> *this)

{
  undefined8 uVar1;
  long in_FS_OFFSET;
  allocator_type local_38;
  key_equal local_29;
  QHasher<QString> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = std::pmr::get_default_resource();
  *(code **)&this->res = QString::QString;
  *(QDuplicateTracker<QString,_32UL> **)&this->field_0x608 = this;
  *(undefined8 *)&this->field_0x610 = 0x600;
  *(undefined8 *)&this->field_0x618 = 0x900;
  *(undefined8 *)&this->field_0x620 = uVar1;
  *(QDuplicateTracker<QString,_32UL> **)&this->field_0x628 = this;
  *(undefined8 *)&this->field_0x630 = 0x600;
  *(undefined8 *)&this->field_0x638 = 0;
  local_38._M_resource = (memory_resource *)&this->res;
  local_28.storedSeed = QHashSeed::globalSeed();
  std::
  _Hashtable<QString,_QString,_std::pmr::polymorphic_allocator<QString>,_std::__detail::_Identity,_std::equal_to<QString>,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_Hashtable(&(this->set)._M_h,0x20,&local_28,&local_29,&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDuplicateTracker() {}